

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O2

OrthographicCamera *
create_ortho_camera(OrthographicCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,
                   float scale)

{
  Vec3 VVar1;
  Vec3 VVar2;
  
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  (__return_storage_ptr__->eye).z = pos.z;
  VVar1.x = pos.x - target.x;
  VVar1.y = pos.y - target.y;
  VVar1.z = pos.z - target.z;
  VVar1 = normalized(VVar1);
  __return_storage_ptr__->basis[2].x = (float)(int)VVar1._0_8_;
  __return_storage_ptr__->basis[2].y = (float)(int)((ulong)VVar1._0_8_ >> 0x20);
  __return_storage_ptr__->basis[2].z = VVar1.z;
  VVar2.z = 1.0;
  VVar2.x = 0.00123;
  VVar2.y = -0.000987;
  VVar2 = cross(VVar2,VVar1);
  VVar2 = normalized(VVar2);
  __return_storage_ptr__->basis[0].x = (float)(int)VVar2._0_8_;
  __return_storage_ptr__->basis[0].y = (float)(int)((ulong)VVar2._0_8_ >> 0x20);
  __return_storage_ptr__->basis[0].z = VVar2.z;
  VVar1 = cross(VVar1,VVar2);
  __return_storage_ptr__->basis[1].x = (float)(int)VVar1._0_8_;
  __return_storage_ptr__->basis[1].y = (float)(int)((ulong)VVar1._0_8_ >> 0x20);
  __return_storage_ptr__->basis[1].z = VVar1.z;
  __return_storage_ptr__->xscale = ratio * scale;
  __return_storage_ptr__->yscale = scale;
  return __return_storage_ptr__;
}

Assistant:

OrthographicCamera create_ortho_camera(Vec3 pos, Vec3 target, float ratio, float scale) {
    OrthographicCamera rval;

    rval.eye = pos;
    rval.basis[2] = normalized(vsub(pos, target));
    rval.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, rval.basis[2])
        );
    rval.basis[1] = cross(rval.basis[2], rval.basis[0]);

    rval.xscale = ratio * scale;
    rval.yscale = scale;

    return rval;
}